

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O1

Vec_Int_t *
Gia_ManInseTest(Gia_Man_t *p,Vec_Int_t *vInit0,int nFrames,int nWords,int nTimeOut,int fSim,
               int fVerbose)

{
  int iVar1;
  Vec_Int_t *vInit0_00;
  int *piVar2;
  Vec_Int_t *pVVar3;
  size_t __size;
  
  vInit0_00 = (Vec_Int_t *)malloc(0x10);
  vInit0_00->nCap = 0;
  vInit0_00->nSize = 0;
  vInit0_00->pArray = (int *)0x0;
  iVar1 = p->nRegs;
  if (0 < (long)iVar1) {
    __size = (long)iVar1 << 2;
    piVar2 = (int *)malloc(__size);
    vInit0_00->pArray = piVar2;
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vInit0_00->nCap = iVar1;
    if (0 < iVar1) {
      memset(vInit0_00->pArray,0,__size);
    }
  }
  vInit0_00->nSize = iVar1;
  pVVar3 = Gia_ManInsePerform(p,vInit0_00,nFrames,nWords,fVerbose);
  if (vInit0_00 != vInit0) {
    if (vInit0_00->pArray != (int *)0x0) {
      free(vInit0_00->pArray);
      vInit0_00->pArray = (int *)0x0;
    }
    free(vInit0_00);
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Gia_ManInseTest( Gia_Man_t * p, Vec_Int_t * vInit0, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose )
{
    Vec_Int_t * vRes, * vInit;
    vInit = Vec_IntAlloc(0); Vec_IntFill( vInit, Gia_ManRegNum(p), 0 );
    vRes = Gia_ManInsePerform( p, vInit, nFrames, nWords, fVerbose );
    if ( vInit != vInit0 )
        Vec_IntFree( vInit );
    return vRes;
}